

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_extended_result_codes(sqlite3 *db,int onoff)

{
  if (db->mutex == (sqlite3_mutex *)0x0) {
    db->errMask = -(uint)(onoff != 0) | 0xff;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    db->errMask = -(uint)(onoff != 0) | 0xff;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_extended_result_codes(sqlite3 *db, int onoff){
  sqlite3_mutex_enter(db->mutex);
  db->errMask = onoff ? 0xffffffff : 0xff;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}